

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Vec_Int_t * Gia_ManFindMapping(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  iVar1 = p->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 << 2);
  }
  iVar5 = vChains->nSize;
  if (0 < (long)iVar5) {
    pVVar2 = vChains->pArray;
    iVar7 = -1;
    lVar6 = 0;
    do {
      if (pVVar2[lVar6].nSize < 1) {
        __assert_fail("Vec_IntSize(vChain) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0x264,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      if (0 < pVVar2[lVar6].nSize) {
        piVar3 = pVVar2[lVar6].pArray;
        lVar8 = 0;
        do {
          iVar7 = piVar3[lVar8];
          if ((iVar7 < 0) || (uVar9 = iVar7 * 5 + 3, vFadds->nSize <= (int)uVar9))
          goto LAB_0066acc5;
          lVar10 = (long)vFadds->pArray[uVar9];
          if ((lVar10 < 0) || (iVar1 <= vFadds->pArray[uVar9])) goto LAB_0066acc5;
          if (__s[lVar10] != -1) {
            __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0x268,
                          "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                         );
          }
          __s[lVar10] = (int)lVar6;
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar2[lVar6].nSize);
      }
      if ((iVar7 < 0) || (uVar9 = iVar7 * 5 + 4, vFadds->nSize <= (int)uVar9)) {
LAB_0066acc5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar8 = (long)vFadds->pArray[uVar9];
      if ((lVar8 < 0) || (iVar1 <= vFadds->pArray[uVar9])) goto LAB_0066acc5;
      if (__s[lVar8] != -1) {
        __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0x26c,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      __s[lVar8] = (int)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar5);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_ManFindMapping( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd = -1;
    Vec_Int_t * vMap2Chain = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        assert( Vec_IntSize(vChain) > 0 );
        Vec_IntForEachEntry( vChain, iFadd, k )
        {
            //printf( "Chain %d: setting SUM %d (obj %d)\n", i, k, Vec_IntEntry(vFadds, 5*iFadd+3) );
            assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1 );
            Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3), i );
        }
        //printf( "Chain %d: setting CARRY (obj %d)\n", i, Vec_IntEntry(vFadds, 5*iFadd+4) );
        assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1 );
        Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4), i );
    }
    return vMap2Chain;
}